

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

double CalcPriority(TProblem *p,
                   unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                   *serveTime,TCacheReq *candidate)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> _Var4;
  ulong uVar5;
  unsigned_long uVar6;
  bool bVar7;
  reference this;
  reference puVar8;
  mapped_type *pmVar9;
  pointer ppVar10;
  pointer ppVar11;
  reference pvVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool local_a1;
  _Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false> local_a0;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> local_98;
  key_type local_90;
  _Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false> local_80;
  iterator foundRequestCount;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> local_68;
  iterator foundLatency;
  size_t currentServeTime;
  size_t e;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  size_t savedTime;
  TCacheReq *candidate_local;
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  *serveTime_local;
  TProblem *p_local;
  
  __range1 = (value_type *)0x0;
  this = std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::operator[](&p->VideoEndpoints,candidate->VideoId);
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this);
  e = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&e), bVar7) {
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    _Var4._M_cur = (__node_type *)*puVar8;
    foundLatency.super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>)
             (_Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>)
             _Var4._M_cur;
    pmVar9 = std::
             unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
             ::operator[](serveTime,(key_type *)&foundLatency);
    uVar5 = *pmVar9;
    foundRequestCount.
    super__Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false>)
         (_Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false>)_Var4._M_cur;
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<TEndpointCache,_unsigned_long,_std::hash<TEndpointCache>,_std::equal_to<TEndpointCache>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>_>
         ::find(&p->Latencies,(key_type *)&foundRequestCount);
    local_90.VideoId = candidate->VideoId;
    local_90.EndpointId = (size_t)_Var4._M_cur;
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
         ::find(&p->RequestsCount,&local_90);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<TEndpointCache,_unsigned_long,_std::hash<TEndpointCache>,_std::equal_to<TEndpointCache>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>_>
         ::end(&p->Latencies);
    bVar7 = std::__detail::operator!=(&local_68,&local_98);
    local_a1 = false;
    if (bVar7) {
      ppVar11 = std::__detail::
                _Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>
                            *)&local_68);
      local_a1 = false;
      if (ppVar11->second < uVar5) {
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
             ::end(&p->RequestsCount);
        local_a1 = std::__detail::operator!=(&local_80,&local_a0);
      }
    }
    if (local_a1 != false) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<const_TEndpointVideo,_unsigned_long>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_TEndpointVideo,_unsigned_long>,_false,_false>
                            *)&local_80);
      uVar6 = ppVar10->second;
      ppVar11 = std::__detail::
                _Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>
                            *)&local_68);
      __range1 = (value_type *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + uVar6 * (uVar5 - ppVar11->second));
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  auVar13._8_4_ = (int)((ulong)__range1 >> 0x20);
  auVar13._0_8_ = __range1;
  auVar13._12_4_ = 0x45300000;
  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&p->Vides,candidate->VideoId);
  vVar1 = *pvVar12;
  auVar14._8_4_ = (int)(vVar1 >> 0x20);
  auVar14._0_8_ = vVar1;
  auVar14._12_4_ = 0x45300000;
  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&p->Capacities,candidate->ServerId);
  vVar2 = *pvVar12;
  auVar15._8_4_ = (int)(vVar2 >> 0x20);
  auVar15._0_8_ = vVar2;
  auVar15._12_4_ = 0x45300000;
  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&p->Vides,candidate->VideoId);
  vVar3 = *pvVar12;
  auVar16._8_4_ = (int)(vVar3 >> 0x20);
  auVar16._0_8_ = vVar3;
  auVar16._12_4_ = 0x45300000;
  return (((auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
          ((auVar14._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) +
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0)) -
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)vVar3) - 4503599627370496.0));
}

Assistant:

double CalcPriority(
        TProblem& p,
        std::unordered_map<TEndpointVideo, size_t>& serveTime,
        TCacheReq& candidate
    ) {
    size_t savedTime = 0;
    for (size_t e : p.VideoEndpoints[candidate.VideoId]) {
        size_t currentServeTime = serveTime[{e, candidate.VideoId}];
        auto foundLatency = p.Latencies.find({e, candidate.ServerId});
        auto foundRequestCount = p.RequestsCount.find({e, candidate.VideoId});
        if (foundLatency != p.Latencies.end() &&
            foundLatency->second < currentServeTime &&
            foundRequestCount != p.RequestsCount.end()) {
            savedTime += foundRequestCount->second * (currentServeTime - foundLatency->second);
        }
    }
    return static_cast<double>(savedTime) / p.Vides[candidate.VideoId] +
        p.Capacities[candidate.ServerId] - p.Vides[candidate.VideoId];
}